

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int cm_zlib_inflateEnd(z_streamp strm)

{
  voidpf pvVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = inflateStateCheck(strm);
  iVar3 = -2;
  if (iVar2 == 0) {
    pvVar1 = *(voidpf *)&strm->state->method;
    if (pvVar1 != (voidpf)0x0) {
      (*strm->zfree)(strm->opaque,pvVar1);
    }
    (*strm->zfree)(strm->opaque,strm->state);
    strm->state = (internal_state *)0x0;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ZEXPORT inflateEnd(strm)
z_streamp strm;
{
    struct inflate_state FAR *state;
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (state->window != Z_NULL) ZFREE(strm, state->window);
    ZFREE(strm, strm->state);
    strm->state = Z_NULL;
    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}